

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O3

bool __thiscall
cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
::matches(cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
          *this,string *input)

{
  char cVar1;
  pointer pcVar2;
  size_type __n1;
  size_t __n;
  size_type sVar3;
  int iVar4;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  if (this->Type == Zero) {
    __n = input->_M_string_length;
    if (__n != (this->Name)._M_string_length) {
      return false;
    }
    if (__n == 0) {
      return true;
    }
    iVar4 = bcmp((input->_M_dataplus)._M_p,(this->Name)._M_dataplus._M_p,__n);
  }
  else {
    local_28._M_str = (input->_M_dataplus)._M_p;
    local_28._M_len = input->_M_string_length;
    pcVar2 = (this->Name)._M_dataplus._M_p;
    __n1 = (this->Name)._M_string_length;
    if (this->SeparatorNeeded != No) {
      __str_00._M_str = pcVar2;
      __str_00._M_len = __n1;
      iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_28,0,__n1,__str_00);
      if (iVar4 != 0) {
        return false;
      }
      sVar3 = (this->Name)._M_string_length;
      if (input->_M_string_length == sVar3) {
        return true;
      }
      cVar1 = (input->_M_dataplus)._M_p[sVar3];
      return cVar1 == ' ' || cVar1 == '=';
    }
    __str._M_str = pcVar2;
    __str._M_len = __n1;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_28,0,__n1,__str);
  }
  return iVar4 == 0;
}

Assistant:

bool matches(std::string const& input) const
  {
    bool matched = false;
    if (this->Type == Values::Zero) {
      matched = (input == this->Name);
    } else if (this->SeparatorNeeded == RequiresSeparator::No) {
      matched = cmHasPrefix(input, this->Name);
    } else if (cmHasPrefix(input, this->Name)) {
      if (input.size() == this->Name.size()) {
        matched = true;
      } else {
        matched =
          (input[this->Name.size()] == '=' || input[this->Name.size()] == ' ');
      }
    }
    return matched;
  }